

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

QModelIndexList * __thiscall
QTableView::selectedIndexes(QModelIndexList *__return_storage_ptr__,QTableView *this)

{
  long lVar1;
  QArrayData *pQVar2;
  char cVar3;
  int *piVar4;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tVar5;
  long in_FS_OFFSET;
  QModelIndex local_70;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QModelIndex *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (((*(long *)(lVar1 + 800) != 0) && (*(int *)(*(long *)(lVar1 + 800) + 4) != 0)) &&
     (*(long *)(lVar1 + 0x328) != 0)) {
    QItemSelectionModel::selectedIndexes();
    pQVar2 = (QArrayData *)CONCAT44(local_58.c,local_58.r);
    if (local_58.m.ptr != (QAbstractItemModel *)0x0) {
      piVar4 = (int *)CONCAT44(local_58.i._4_4_,(int)local_58.i);
      tVar5.ptr = local_58.m.ptr;
      do {
        local_58.m.ptr = *(QAbstractItemModel **)(piVar4 + 4);
        local_58.r = *piVar4;
        local_58.c = piVar4[1];
        local_58.i._0_4_ = piVar4[2];
        local_58.i._4_4_ = piVar4[3];
        cVar3 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget + 0x2c0))(this,&local_58);
        if (cVar3 == '\0') {
          if (local_58.m.ptr == (QAbstractItemModel *)0x0) {
            local_70.r = -1;
            local_70.c = -1;
            local_70.i = 0;
            local_70.m.ptr = (QAbstractItemModel *)0x0;
          }
          else {
            (**(code **)(*(long *)local_58.m.ptr + 0x68))(&local_70,local_58.m.ptr,&local_58);
          }
          cVar3 = comparesEqual((QPersistentModelIndex *)(lVar1 + 0x3b8),&local_70);
          if (cVar3 != '\0') {
            QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex_const&>
                      ((QMovableArrayOps<QModelIndex> *)__return_storage_ptr__,
                       (__return_storage_ptr__->d).size,&local_58);
            QList<QModelIndex>::end(__return_storage_ptr__);
          }
        }
        piVar4 = piVar4 + 6;
        tVar5.ptr = tVar5.ptr + -1;
      } while (tVar5.ptr != (QAbstractItemModel *)0x0);
    }
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,0x18,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndexList QTableView::selectedIndexes() const
{
    Q_D(const QTableView);
    QModelIndexList viewSelected;
    QModelIndexList modelSelected;
    if (d->selectionModel)
        modelSelected = d->selectionModel->selectedIndexes();
    for (int i = 0; i < modelSelected.size(); ++i) {
        QModelIndex index = modelSelected.at(i);
        if (!isIndexHidden(index) && index.parent() == d->root)
            viewSelected.append(index);
    }
    return viewSelected;
}